

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O0

char * filter_escapes(char *str)

{
  char *pcVar1;
  char *local_30;
  char *i;
  GString *debug_str;
  GString *result;
  char *str_local;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    g_return_if_fail_warning("rifiuti2","filter_escapes","(str != NULL) && (*str != \'\\0\')");
    str_local = (char *)0x0;
  }
  else {
    debug_str = (GString *)g_string_new(0);
    local_30 = str;
    do {
      if (*local_30 == '\\') {
        pcVar1 = local_30 + 1;
        switch(local_30[1]) {
        case 'e':
          debug_str = g_string_append_c_inline(debug_str,'\x1b');
          local_30 = pcVar1;
          break;
        default:
          debug_str = g_string_append_c_inline(debug_str,'\\');
          break;
        case 'n':
          debug_str = g_string_append_c_inline(debug_str,'\n');
          local_30 = pcVar1;
          break;
        case 'r':
          debug_str = g_string_append_c_inline(debug_str,'\r');
          local_30 = pcVar1;
          break;
        case 't':
          debug_str = g_string_append_c_inline(debug_str,'\t');
          local_30 = pcVar1;
        }
      }
      else {
        debug_str = g_string_append_c_inline(debug_str,*local_30);
      }
      pcVar1 = local_30 + 1;
      local_30 = local_30 + 1;
    } while (*pcVar1 != '\0');
    i = (char *)g_string_new("filtered delimiter = ");
    local_30 = debug_str->str;
    do {
      if ((*local_30 < ' ') || ('~' < *local_30)) {
        g_string_append_printf(i,"\\x%02X",*local_30);
      }
      else {
        i = (char *)g_string_append_c_inline((GString *)i,*local_30);
      }
      pcVar1 = local_30 + 1;
      local_30 = local_30 + 1;
    } while (*pcVar1 != '\0');
    g_log("rifiuti2",0x80,"%s",*(undefined8 *)i);
    g_string_free(i,1);
    str_local = (char *)g_string_free(debug_str,0);
  }
  return str_local;
}

Assistant:

char *
filter_escapes (const char *str)
{
    GString *result, *debug_str;
    char *i = (char *) str;

    g_return_val_if_fail ( (str != NULL) && (*str != '\0'), NULL);

    result = g_string_new (NULL);
    do
    {
        if ( *i != '\\' )
        {
            result = g_string_append_c (result, *i);
            continue;
        }

        switch ( *(++i) )
        {
          case 'r':
            result = g_string_append_c (result, '\r'); break;
          case 'n':
            result = g_string_append_c (result, '\n'); break;
          case 't':
            result = g_string_append_c (result, '\t'); break;
          case 'e':
            result = g_string_append_c (result, '\x1B'); break;
          default:
            result = g_string_append_c (result, '\\'); i--;
        }
    }
    while ( *(++i) );

    debug_str = g_string_new ("filtered delimiter = ");
    i = result->str;
    do
    {
        if ( *i >= 0x20 && *i <= 0x7E )  /* problem during linking with g_ascii_isprint */
            debug_str = g_string_append_c (debug_str, *i);
        else
            g_string_append_printf (debug_str, "\\x%02X", *(unsigned char *) i);
    }
    while ( *(++i) );
    g_debug ("%s", debug_str->str);
    g_string_free (debug_str, TRUE);
    return g_string_free (result, FALSE);
}